

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O3

NaReal ask_user_real(char *szPrompt,NaReal fDefault)

{
  char enter [30];
  char local_28 [32];
  
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  local_28[0x18] = '\0';
  local_28[0x19] = '\0';
  local_28[0x1a] = '\0';
  local_28[0x1b] = '\0';
  local_28[0x1c] = '\0';
  local_28[0x1d] = '\0';
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  printf("%s <%g>: ",szPrompt);
  fgets(local_28,0x1d,_stdin);
  if ((local_28[0] != '\0') && (local_28[0] != '\n')) {
    fDefault = strtod(local_28,(char **)0x0);
  }
  return fDefault;
}

Assistant:

NaReal
ask_user_real (const char* szPrompt, NaReal fDefault)
{
    char    enter[30] = "";
    printf("%s <%g>: ", szPrompt, fDefault);
    fgets(enter, sizeof(enter)-1, stdin);
    if('\0' == enter[0] || '\n' == enter[0])
        return fDefault;
    return strtod(enter, NULL);
}